

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesH9
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H9 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  size_t *psVar1;
  uint8_t *puVar2;
  long lVar3;
  ushort uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint8_t *puVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  ushort uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  size_t sVar29;
  uint uVar30;
  ulong uVar31;
  Command *pCVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  ulong local_128;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_d8;
  ulong local_d0;
  ulong local_b0;
  ulong local_a8;
  size_t local_88;
  
  local_88 = *last_insert_len;
  uVar22 = position + num_bytes;
  uVar8 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar8 = position;
  }
  lVar13 = 0x200;
  if (params->quality < 9) {
    lVar13 = 0x40;
  }
  pCVar32 = commands;
  if (uVar22 <= position + 4) {
LAB_0010909f:
    *last_insert_len = (local_88 + uVar22) - position;
    *num_commands = *num_commands + ((long)pCVar32 - (long)commands >> 4);
    return;
  }
  uVar19 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  local_f0 = lVar13 + position;
  lVar3 = position - 1;
  uVar18 = position;
LAB_001080fa:
  local_108 = uVar22 - uVar18;
  uVar11 = uVar19;
  if (uVar18 < uVar19) {
    uVar11 = uVar18;
  }
  uVar20 = uVar18 & ringbuffer_mask;
  puVar2 = ringbuffer + uVar20;
  uVar34 = (ulong)((uint)local_108 & 7);
  uVar9 = local_108 & 0xfffffffffffffff8;
  local_d8 = 0x1f90;
  bVar36 = false;
  uVar27 = 0;
  uVar31 = 0;
  local_f8 = 0;
  local_100 = 0;
  do {
    uVar24 = (long)kDistanceCacheOffset[uVar31] + (long)dist_cache[kDistanceCacheIndex[uVar31]];
    if (((uVar24 <= uVar11) && (uVar18 - uVar24 < uVar18)) && (uVar27 + uVar20 <= ringbuffer_mask))
    {
      uVar14 = uVar18 - uVar24 & ringbuffer_mask;
      if ((uVar14 + uVar27 <= ringbuffer_mask) &&
         (ringbuffer[uVar27 + uVar20] == ringbuffer[uVar14 + uVar27])) {
        if (7 < local_108) {
          lVar15 = 0;
          uVar26 = 0;
LAB_001081f4:
          if (*(ulong *)(puVar2 + uVar26 * 8) == *(ulong *)(ringbuffer + uVar26 * 8 + uVar14))
          goto code_r0x00108206;
          uVar26 = *(ulong *)(ringbuffer + uVar26 * 8 + uVar14) ^ *(ulong *)(puVar2 + uVar26 * 8);
          uVar14 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          uVar26 = (uVar14 >> 3 & 0x1fffffff) - lVar15;
          goto LAB_00108238;
        }
        puVar16 = puVar2;
        uVar28 = 0;
LAB_00108294:
        uVar26 = uVar28;
        if (uVar34 != 0) {
          uVar35 = uVar34 | uVar28;
          uVar33 = uVar34;
          do {
            uVar26 = uVar28;
            if (ringbuffer[uVar28 + uVar14] != *puVar16) break;
            puVar16 = puVar16 + 1;
            uVar28 = uVar28 + 1;
            uVar33 = uVar33 - 1;
            uVar26 = uVar35;
          } while (uVar33 != 0);
        }
LAB_00108238:
        if (((2 < uVar26) || ((uVar31 < 2 && (uVar26 == 2)))) &&
           (uVar14 = uVar26 * 0x21c + kDistanceShortCodeCost[uVar31], local_d8 < uVar14)) {
          bVar36 = true;
          uVar27 = uVar26;
          local_100 = uVar24;
          local_f8 = uVar26;
          local_d8 = uVar14;
        }
      }
    }
    uVar31 = uVar31 + 1;
  } while (uVar31 != 0x10);
  uVar30 = (uint)(*(int *)(ringbuffer + uVar20) * 0x1e35a7bd) >> 0x11;
  lVar15 = (ulong)(uVar30 << 10) + 0x10000;
  uVar4 = hasher->num_[uVar30];
  uVar34 = (ulong)(uVar4 - 0x100);
  if (uVar4 < 0x101) {
    uVar34 = 0;
  }
  uVar24 = (ulong)((uint)local_108 & 7);
  uVar31 = (ulong)uVar4;
  do {
    if (uVar31 <= uVar34) break;
    uVar31 = uVar31 - 1;
    uVar7 = *(uint *)((long)hasher->buckets_ + (uVar31 & 0xff) * 4 + lVar15 + -0x10000);
    uVar14 = uVar18 - uVar7;
    if ((uVar14 <= uVar11) && (uVar27 + uVar20 <= ringbuffer_mask)) {
      uVar26 = (ulong)(uVar7 & (uint)ringbuffer_mask);
      if ((uVar26 + uVar27 <= ringbuffer_mask) &&
         (ringbuffer[uVar27 + uVar20] == ringbuffer[uVar26 + uVar27])) {
        if (7 < local_108) {
          lVar17 = 0;
          uVar28 = 0;
LAB_0010837d:
          if (*(ulong *)(puVar2 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + uVar26))
          goto code_r0x0010838f;
          uVar28 = *(ulong *)(ringbuffer + uVar28 * 8 + uVar26) ^ *(ulong *)(puVar2 + uVar28 * 8);
          uVar26 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
          uVar28 = (uVar26 >> 3 & 0x1fffffff) - lVar17;
          goto LAB_001083b6;
        }
        puVar16 = ringbuffer + uVar20;
        uVar33 = 0;
LAB_0010840b:
        uVar28 = uVar33;
        if (uVar24 != 0) {
          uVar10 = uVar24 | uVar33;
          uVar35 = uVar24;
          do {
            uVar28 = uVar33;
            if (ringbuffer[uVar33 + uVar26] != *puVar16) break;
            puVar16 = puVar16 + 1;
            uVar33 = uVar33 + 1;
            uVar35 = uVar35 - 1;
            uVar28 = uVar10;
          } while (uVar35 != 0);
        }
LAB_001083b6:
        if (3 < uVar28) {
          iVar21 = 0x1f;
          if ((uint)uVar14 != 0) {
            for (; (uint)uVar14 >> iVar21 == 0; iVar21 = iVar21 + -1) {
            }
          }
          uVar26 = (ulong)(iVar21 * -0x78 + 0x1e00) + uVar28 * 0x21c;
          if (local_d8 < uVar26) {
            bVar36 = true;
            uVar27 = uVar28;
            local_100 = uVar14;
            local_f8 = uVar28;
            local_d8 = uVar26;
          }
        }
      }
    }
  } while (uVar14 <= uVar11);
  *(int *)((long)hasher->buckets_ + ((ulong)uVar4 & 0xff) * 4 + lVar15 + -0x10000) = (int)uVar18;
  hasher->num_[uVar30] = uVar4 + 1;
  if (bVar36) {
    local_110 = 0;
    bVar36 = false;
  }
  else {
    if ((hasher->dict_search_stats_).num_lookups >> 7 <= (hasher->dict_search_stats_).num_matches) {
      uVar27 = (ulong)(uVar30 & 0xfffffffe);
      sVar29 = (hasher->dict_search_stats_).num_lookups;
      bVar36 = false;
      local_110 = 0;
      lVar15 = 0;
LAB_001084d8:
      uVar4 = kStaticDictionaryHash[uVar27];
      sVar29 = sVar29 + 1;
      (hasher->dict_search_stats_).num_lookups = sVar29;
      if ((ulong)uVar4 != 0) {
        uVar9 = (ulong)(uVar4 & 0x1f);
        bVar37 = true;
        if (uVar9 <= local_108) {
          puVar16 = &kBrotliDictionary +
                    uVar9 * (uVar4 >> 5) +
                    (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar9 * 4);
          if (7 < uVar9) {
            uVar34 = (ulong)(uVar4 & 0x18);
            lVar17 = 0;
            uVar20 = 0;
LAB_0010857a:
            if (*(ulong *)(puVar16 + uVar20 * 8) == *(ulong *)(puVar2 + uVar20 * 8))
            goto code_r0x0010858d;
            uVar34 = *(ulong *)(puVar2 + uVar20 * 8) ^ *(ulong *)(puVar16 + uVar20 * 8);
            uVar20 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
              }
            }
            uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar17;
            goto LAB_001085c3;
          }
          uVar34 = 0;
          goto LAB_00108648;
        }
        goto LAB_00108504;
      }
      goto LAB_00108527;
    }
    bVar36 = true;
    local_110 = 0;
  }
  goto LAB_00108693;
code_r0x00108206:
  uVar26 = uVar26 + 1;
  lVar15 = lVar15 + -8;
  puVar16 = puVar2 + uVar9;
  uVar28 = uVar9;
  if (local_108 >> 3 == uVar26) goto LAB_00108294;
  goto LAB_001081f4;
code_r0x0010838f:
  uVar28 = uVar28 + 1;
  lVar17 = lVar17 + -8;
  puVar16 = puVar2 + uVar9;
  uVar33 = uVar9;
  if (local_108 >> 3 == uVar28) goto LAB_0010840b;
  goto LAB_0010837d;
code_r0x0010858d:
  uVar20 = uVar20 + 1;
  lVar17 = lVar17 + -8;
  if ((uVar4 & 0x1f) >> 3 == uVar20) goto code_r0x00108599;
  goto LAB_0010857a;
code_r0x00108599:
  puVar16 = puVar16 + -lVar17;
LAB_00108648:
  uVar31 = (ulong)uVar4 & 7;
  uVar20 = uVar34;
  if ((uVar4 & 7) != 0) {
    uVar24 = uVar34 | uVar31;
    do {
      uVar20 = uVar34;
      if (puVar2[uVar34] != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar34 = uVar34 + 1;
      uVar31 = uVar31 - 1;
      uVar20 = uVar24;
    } while (uVar31 != 0);
  }
LAB_001085c3:
  if ((uVar20 != 0) && (uVar9 < uVar20 + 10)) {
    uVar34 = (ulong)(uVar4 >> 5) + uVar11 + 1 +
             ((ulong)""[uVar9 - uVar20] << ((&kBrotliDictionarySizeBitsByLength)[uVar9] & 0x3f));
    iVar21 = 0x1f;
    uVar30 = (uint)uVar34;
    if (uVar30 != 0) {
      for (; uVar30 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar31 = (uVar20 * 0x21c - (ulong)(uint)(iVar21 * 0x78)) + 0x1e00;
    if (local_d8 <= uVar31) {
      local_110 = uVar9 ^ uVar20;
      bVar37 = false;
      local_100 = uVar34;
      local_f8 = uVar20;
      local_d8 = uVar31;
    }
  }
LAB_00108504:
  if (!bVar37) {
    psVar1 = &(hasher->dict_search_stats_).num_matches;
    *psVar1 = *psVar1 + 1;
    bVar36 = true;
  }
LAB_00108527:
  uVar27 = uVar27 + 1;
  bVar37 = lVar15 != 0;
  lVar15 = lVar15 + 1;
  if (bVar37) goto LAB_0010867e;
  goto LAB_001084d8;
LAB_0010867e:
  bVar36 = !bVar36;
LAB_00108693:
  if (!bVar36) {
    uVar11 = (lVar3 + num_bytes) - uVar18;
    iVar21 = 0;
LAB_00108736:
    local_108 = local_108 - 1;
    uVar27 = local_f8 - 1;
    if (local_108 <= local_f8 - 1) {
      uVar27 = local_108;
    }
    if (4 < params->quality) {
      uVar27 = 0;
    }
    uVar20 = uVar18 + 1;
    uVar9 = uVar19;
    if (uVar20 < uVar19) {
      uVar9 = uVar20;
    }
    uVar24 = uVar20 & ringbuffer_mask;
    puVar2 = ringbuffer + uVar24;
    uVar34 = (ulong)((uint)local_108 & 7);
    local_128 = 0x1f90;
    bVar36 = false;
    uVar31 = 0;
    local_b0 = 0;
    local_d0 = 0;
LAB_001087c1:
    uVar14 = (long)kDistanceCacheOffset[uVar31] + (long)dist_cache[kDistanceCacheIndex[uVar31]];
    if (((uVar14 <= uVar9) && (uVar20 - uVar14 < uVar20)) && (uVar27 + uVar24 <= ringbuffer_mask)) {
      uVar26 = uVar20 - uVar14 & ringbuffer_mask;
      if ((ringbuffer_mask < uVar26 + uVar27) ||
         (ringbuffer[uVar27 + uVar24] != ringbuffer[uVar26 + uVar27])) goto LAB_001088b9;
      uVar28 = uVar34;
      if (7 < local_108) {
        lVar15 = 0;
        uVar33 = 0;
LAB_00108836:
        if (*(ulong *)(puVar2 + uVar33 * 8) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar26))
        goto code_r0x00108848;
        uVar28 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar26) ^ *(ulong *)(puVar2 + uVar33 * 8);
        uVar26 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        uVar33 = (uVar26 >> 3 & 0x1fffffff) - lVar15;
        goto LAB_00108874;
      }
      uVar33 = 0;
      puVar16 = puVar2;
      goto joined_r0x001088d3;
    }
    goto LAB_001088b9;
  }
  local_88 = local_88 + 1;
  position = uVar18 + 1;
  if (local_f0 < position) {
    if ((uint)((int)lVar13 * 4) + local_f0 < position) {
      uVar11 = uVar18 + 0x11;
      if (uVar22 - 4 <= uVar18 + 0x11) {
        uVar11 = uVar22 - 4;
      }
      for (; position < uVar11; position = position + 4) {
        uVar30 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar5 = hasher->num_[uVar30];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar30 * 0x400 + (uint)(byte)uVar5 * 4)) =
             (int)position;
        hasher->num_[uVar30] = uVar5 + 1;
        local_88 = local_88 + 4;
      }
    }
    else {
      uVar11 = uVar18 + 9;
      if (uVar22 - 3 <= uVar18 + 9) {
        uVar11 = uVar22 - 3;
      }
      for (; position < uVar11; position = position + 2) {
        uVar30 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar5 = hasher->num_[uVar30];
        *(int *)((long)hasher->buckets_ + (ulong)(uVar30 * 0x400 + (uint)(byte)uVar5 * 4)) =
             (int)position;
        hasher->num_[uVar30] = uVar5 + 1;
        local_88 = local_88 + 2;
      }
    }
  }
  goto LAB_00109035;
code_r0x00108848:
  uVar33 = uVar33 + 1;
  lVar15 = lVar15 + -8;
  if (uVar11 >> 3 == uVar33) goto code_r0x00108856;
  goto LAB_00108836;
code_r0x00108856:
  uVar33 = -lVar15;
  puVar16 = puVar2 + -lVar15;
joined_r0x001088d3:
  for (; (uVar28 != 0 && (ringbuffer[uVar33 + uVar26] == *puVar16)); uVar33 = uVar33 + 1) {
    puVar16 = puVar16 + 1;
    uVar28 = uVar28 - 1;
  }
LAB_00108874:
  if (((2 < uVar33) || ((uVar31 < 2 && (uVar33 == 2)))) &&
     (uVar26 = uVar33 * 0x21c + kDistanceShortCodeCost[uVar31], local_128 < uVar26)) {
    bVar36 = true;
    uVar27 = uVar33;
    local_128 = uVar26;
    local_d0 = uVar14;
    local_b0 = uVar33;
  }
LAB_001088b9:
  uVar31 = uVar31 + 1;
  if (uVar31 == 0x10) goto LAB_001088ed;
  goto LAB_001087c1;
LAB_001088ed:
  uVar30 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0x11;
  lVar15 = (ulong)(uVar30 << 10) + 0x10000;
  uVar4 = hasher->num_[uVar30];
  uVar34 = (ulong)(uVar4 - 0x100);
  if (uVar4 < 0x101) {
    uVar34 = 0;
  }
  uVar14 = (ulong)((uint)local_108 & 7);
  uVar31 = (ulong)uVar4;
LAB_00108944:
  if (uVar34 < uVar31) {
    uVar31 = uVar31 - 1;
    uVar7 = *(uint *)((long)hasher->buckets_ + (uVar31 & 0xff) * 4 + lVar15 + -0x10000);
    uVar26 = uVar20 - uVar7;
    if ((uVar26 <= uVar9) && (uVar27 + uVar24 <= ringbuffer_mask)) {
      uVar28 = (ulong)(uVar7 & (uint)ringbuffer_mask);
      if ((ringbuffer_mask < uVar28 + uVar27) ||
         (ringbuffer[uVar27 + uVar24] != ringbuffer[uVar28 + uVar27])) goto LAB_00108a39;
      uVar33 = uVar14;
      if (7 < local_108) {
        lVar17 = 0;
        uVar35 = 0;
LAB_001089ad:
        if (*(ulong *)(puVar2 + uVar35 * 8) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar28))
        goto code_r0x001089bf;
        uVar33 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar28) ^ *(ulong *)(puVar2 + uVar35 * 8);
        uVar28 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar35 = (uVar28 >> 3 & 0x1fffffff) - lVar17;
        goto LAB_001089ea;
      }
      uVar35 = 0;
      puVar16 = ringbuffer + uVar24;
      goto joined_r0x00108a4e;
    }
    goto LAB_00108a39;
  }
  goto LAB_00108a68;
code_r0x001089bf:
  uVar35 = uVar35 + 1;
  lVar17 = lVar17 + -8;
  if (uVar11 >> 3 == uVar35) goto code_r0x001089cd;
  goto LAB_001089ad;
code_r0x001089cd:
  uVar35 = -lVar17;
  puVar16 = puVar2 + -lVar17;
joined_r0x00108a4e:
  for (; (uVar33 != 0 && (ringbuffer[uVar35 + uVar28] == *puVar16)); uVar35 = uVar35 + 1) {
    puVar16 = puVar16 + 1;
    uVar33 = uVar33 - 1;
  }
LAB_001089ea:
  if (3 < uVar35) {
    iVar6 = 0x1f;
    if ((uint)uVar26 != 0) {
      for (; (uint)uVar26 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar28 = (ulong)(iVar6 * -0x78 + 0x1e00) + uVar35 * 0x21c;
    if (local_128 < uVar28) {
      bVar36 = true;
      uVar27 = uVar35;
      local_128 = uVar28;
      local_d0 = uVar26;
      local_b0 = uVar35;
    }
  }
LAB_00108a39:
  if (uVar9 < uVar26) goto LAB_00108a68;
  goto LAB_00108944;
LAB_00108a68:
  *(int *)((long)hasher->buckets_ + ((ulong)uVar4 & 0xff) * 4 + lVar15 + -0x10000) = (int)uVar20;
  hasher->num_[uVar30] = uVar4 + 1;
  if (bVar36) {
    bVar36 = false;
  }
  else {
    if ((hasher->dict_search_stats_).num_lookups >> 7 <= (hasher->dict_search_stats_).num_matches) {
      uVar27 = (ulong)(uVar30 & 0xfffffffe);
      sVar29 = (hasher->dict_search_stats_).num_lookups;
      bVar36 = false;
      local_a8 = 0;
      lVar15 = 0;
LAB_00108b64:
      uVar4 = kStaticDictionaryHash[uVar27];
      sVar29 = sVar29 + 1;
      (hasher->dict_search_stats_).num_lookups = sVar29;
      if ((ulong)uVar4 != 0) {
        uVar34 = (ulong)(uVar4 & 0x1f);
        bVar37 = true;
        if (uVar34 <= local_108) {
          puVar16 = &kBrotliDictionary +
                    uVar34 * (uVar4 >> 5) +
                    (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar34 * 4);
          if (7 < uVar34) {
            uVar24 = (ulong)(uVar4 & 0x18);
            lVar17 = 0;
            uVar31 = 0;
LAB_00108bfe:
            if (*(ulong *)(puVar16 + uVar31 * 8) == *(ulong *)(puVar2 + uVar31 * 8))
            goto code_r0x00108c10;
            uVar24 = *(ulong *)(puVar2 + uVar31 * 8) ^ *(ulong *)(puVar16 + uVar31 * 8);
            uVar31 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar17;
            goto LAB_00108c42;
          }
          uVar24 = 0;
          goto LAB_00108cc8;
        }
        goto LAB_00108b90;
      }
      goto LAB_00108bab;
    }
    bVar36 = true;
  }
  local_a8 = 0;
LAB_00108abe:
  bVar37 = false;
  if ((!bVar36) && (local_d8 + 700 <= local_128)) {
    local_88 = local_88 + 1;
    bVar37 = iVar21 < 3 && uVar18 + 5 < uVar22;
    local_100 = local_d0;
    local_f8 = local_b0;
    uVar18 = uVar20;
    local_d8 = local_128;
    iVar21 = iVar21 + 1;
    local_110 = local_a8;
  }
  uVar11 = uVar11 - 1;
  if (!bVar37) goto LAB_00108d18;
  goto LAB_00108736;
code_r0x00108c10:
  uVar31 = uVar31 + 1;
  lVar17 = lVar17 + -8;
  if ((uVar4 & 0x1f) >> 3 == uVar31) goto code_r0x00108c1c;
  goto LAB_00108bfe;
code_r0x00108c1c:
  puVar16 = puVar16 + -lVar17;
LAB_00108cc8:
  uVar14 = (ulong)uVar4 & 7;
  uVar31 = uVar24;
  if ((uVar4 & 7) != 0) {
    uVar26 = uVar24 | uVar14;
    do {
      uVar31 = uVar24;
      if (puVar2[uVar24] != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar24 = uVar24 + 1;
      uVar14 = uVar14 - 1;
      uVar31 = uVar26;
    } while (uVar14 != 0);
  }
LAB_00108c42:
  bVar37 = true;
  if ((uVar31 != 0) && (uVar34 < uVar31 + 10)) {
    uVar24 = (ulong)(uVar4 >> 5) + uVar9 + 1 +
             ((ulong)""[uVar34 - uVar31] << ((&kBrotliDictionarySizeBitsByLength)[uVar34] & 0x3f));
    iVar6 = 0x1f;
    uVar30 = (uint)uVar24;
    if (uVar30 != 0) {
      for (; uVar30 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar14 = (uVar31 * 0x21c - (ulong)(uint)(iVar6 * 0x78)) + 0x1e00;
    if (local_128 <= uVar14) {
      local_a8 = uVar34 ^ uVar31;
      bVar37 = false;
      local_128 = uVar14;
      local_d0 = uVar24;
      local_b0 = uVar31;
    }
  }
LAB_00108b90:
  if (!bVar37) {
    psVar1 = &(hasher->dict_search_stats_).num_matches;
    *psVar1 = *psVar1 + 1;
    bVar36 = true;
  }
LAB_00108bab:
  uVar27 = uVar27 + 1;
  bVar37 = lVar15 != 0;
  lVar15 = lVar15 + 1;
  if (bVar37) goto LAB_00108cfd;
  goto LAB_00108b64;
LAB_00108cfd:
  bVar36 = !bVar36;
  goto LAB_00108abe;
LAB_00108d18:
  uVar11 = uVar19;
  if (uVar18 < uVar19) {
    uVar11 = uVar18;
  }
  if (uVar11 < local_100) {
LAB_00108e15:
    uVar27 = local_100 + 0xf;
  }
  else {
    uVar30 = 0;
    bVar36 = false;
    if (local_100 != (long)*dist_cache) {
      if (local_100 == (long)dist_cache[1]) {
        uVar30 = 1;
      }
      else {
        uVar27 = (local_100 + 3) - (long)*dist_cache;
        if (uVar27 < 7) {
          bVar23 = (byte)((int)uVar27 << 2);
          uVar30 = 0x9750468;
        }
        else {
          uVar27 = (local_100 + 3) - (long)dist_cache[1];
          if (6 < uVar27) {
            if (local_100 != (long)dist_cache[2]) {
              bVar36 = local_100 != (long)dist_cache[3];
              uVar30 = 3;
              goto LAB_00108e0c;
            }
            uVar30 = 2;
            goto LAB_00108e0a;
          }
          bVar23 = (byte)((int)uVar27 << 2);
          uVar30 = 0xfdb1ace;
        }
        uVar30 = uVar30 >> (bVar23 & 0x1f) & 0xf;
      }
LAB_00108e0a:
      bVar36 = false;
    }
LAB_00108e0c:
    if (bVar36) goto LAB_00108e15;
    uVar27 = (ulong)uVar30;
  }
  if ((local_100 <= uVar11) && (uVar27 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_100;
  }
  pCVar32->insert_len_ = (uint32_t)local_88;
  pCVar32->copy_len_ = (uint)local_f8 | (int)local_110 << 0x18;
  if (uVar27 < 0x10) {
    pCVar32->dist_prefix_ = (uint16_t)uVar27;
    uVar30 = 0;
  }
  else {
    uVar30 = 0x1f;
    uVar7 = (uint)(uVar27 - 0xc);
    if (uVar7 != 0) {
      for (; uVar7 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar12 = (uVar30 ^ 0xffffffe0) + 0x1f;
    bVar36 = (uVar27 - 0xc >> ((ulong)uVar12 & 0x3f) & 1) != 0;
    pCVar32->dist_prefix_ = (ushort)bVar36 + (short)(uVar30 ^ 0xffffffe0) * 2 + 0x4c;
    uVar30 = uVar7 - (bVar36 + 2 << ((byte)uVar12 & 0x3f)) | uVar12 * 0x1000000;
  }
  pCVar32->dist_extra_ = uVar30;
  if (local_88 < 6) {
    uVar11 = local_88 & 0xffffffff;
  }
  else if (local_88 < 0x82) {
    uVar30 = 0x1f;
    uVar7 = (uint)(local_88 - 2);
    if (uVar7 != 0) {
      for (; uVar7 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar11 = (ulong)((int)(local_88 - 2 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar30 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_88 < 0x842) {
    uVar7 = (uint32_t)local_88 - 0x42;
    uVar30 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar11 = (ulong)((uVar30 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar11 = 0x15;
    if (0x1841 < local_88) {
      uVar11 = (ulong)(ushort)(0x17 - (local_88 < 0x5842));
    }
  }
  local_110 = local_110 ^ local_f8;
  if (local_110 < 10) {
    uVar30 = (int)local_110 - 2;
  }
  else if (local_110 < 0x86) {
    uVar30 = 0x1f;
    uVar7 = (uint)(local_110 - 6);
    if (uVar7 != 0) {
      for (; uVar7 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar30 = (int)(local_110 - 6 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar30 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar30 = 0x17;
    if (local_110 < 0x846) {
      uVar7 = (int)local_110 - 0x46;
      uVar30 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      uVar30 = (uVar30 ^ 0xffe0) + 0x2c;
    }
  }
  uVar4 = (ushort)uVar30;
  uVar25 = (uVar4 & 7) + ((ushort)uVar11 & 7) * 8;
  if (((pCVar32->dist_prefix_ == 0) && ((ushort)uVar11 < 8)) && (uVar4 < 0x10)) {
    if (7 < uVar4) {
      uVar25 = uVar25 | 0x40;
    }
  }
  else {
    uVar25 = uVar25 | *(ushort *)
                       (CombineLengthCodes_cells +
                       (ulong)((int)((uVar11 & 0xffff) >> 3) * 3 + ((uVar30 & 0xffff) >> 3)) * 2);
  }
  local_f0 = lVar13 + local_f8 * 2 + uVar18;
  pCVar32->cmd_prefix_ = uVar25;
  *num_literals = *num_literals + local_88;
  pCVar32 = pCVar32 + 1;
  uVar11 = uVar18 + 2;
  position = uVar18 + local_f8;
  uVar18 = uVar8;
  if (position < uVar8) {
    uVar18 = position;
  }
  if (uVar11 < uVar18) {
    do {
      uVar30 = (uint)(*(int *)(ringbuffer + (uVar11 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar5 = hasher->num_[uVar30];
      *(int *)((long)hasher->buckets_ + (ulong)(uVar30 * 0x400 + (uint)(byte)uVar5 * 4)) =
           (int)uVar11;
      hasher->num_[uVar30] = uVar5 + 1;
      uVar11 = uVar11 + 1;
    } while (uVar18 != uVar11);
    local_88 = 0;
  }
  else {
    local_88 = 0;
  }
LAB_00109035:
  uVar18 = position;
  if (uVar22 <= position + 4) goto LAB_0010909f;
  goto LAB_001080fa;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}